

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 *local_58 [2];
  undefined1 local_48 [23];
  Colour local_31;
  
  sVar1 = (totals->testCases).passed;
  sVar2 = (totals->testCases).failed;
  sVar3 = (totals->testCases).failedButOk;
  uVar8 = sVar2 + sVar1 + sVar3;
  if (uVar8 == 0) {
    poVar4 = (this->super_StreamingReporterBase).stream;
    local_31.m_moved = false;
    Colour::use(ReconstructedExpression);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,'O');
    std::operator<<(poVar4,(string *)local_58);
  }
  else {
    uVar5 = (sVar2 * 0x50) / uVar8;
    uVar9 = 1;
    uVar10 = uVar5;
    if (sVar2 * 0x50 < uVar8) {
      uVar10 = uVar9;
    }
    if (sVar2 == 0) {
      uVar10 = uVar5;
    }
    uVar6 = (sVar3 * 0x50) / uVar8;
    uVar5 = uVar6;
    if (sVar3 * 0x50 < uVar8) {
      uVar5 = uVar9;
    }
    if (sVar3 == 0) {
      uVar5 = uVar6;
    }
    uVar6 = (sVar1 * 0x50) / uVar8;
    if (uVar8 <= sVar1 * 0x50) {
      uVar9 = uVar6;
    }
    if (sVar1 == 0) {
      uVar9 = uVar6;
    }
    while (uVar6 = uVar9, uVar8 = uVar5, uVar8 + uVar10 + uVar6 < 0x4f) {
      uVar7 = uVar6;
      if (uVar6 < uVar8) {
        uVar7 = uVar8;
      }
      if (uVar8 < uVar10 && uVar6 < uVar10) {
        uVar7 = uVar10;
      }
      uVar7 = uVar7 + 1;
      uVar9 = uVar7;
      uVar5 = uVar8;
      if (uVar6 < uVar8) {
        uVar9 = uVar6;
        uVar5 = uVar7;
      }
      if (uVar8 < uVar10 && uVar6 < uVar10) {
        uVar5 = uVar8;
        uVar10 = uVar7;
        uVar9 = uVar6;
      }
    }
    while (uVar5 = uVar6, uVar9 = uVar8, 0x4f < uVar9 + uVar10 + uVar5) {
      uVar7 = uVar5;
      if (uVar5 < uVar9) {
        uVar7 = uVar9;
      }
      if (uVar9 < uVar10 && uVar5 < uVar10) {
        uVar7 = uVar10;
      }
      uVar7 = uVar7 - 1;
      uVar6 = uVar7;
      uVar8 = uVar9;
      if (uVar5 < uVar9) {
        uVar6 = uVar5;
        uVar8 = uVar7;
      }
      if (uVar9 < uVar10 && uVar5 < uVar10) {
        uVar8 = uVar9;
        uVar10 = uVar7;
        uVar6 = uVar5;
      }
    }
    poVar4 = (this->super_StreamingReporterBase).stream;
    local_31.m_moved = false;
    Colour::use(BrightRed);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar10);
    std::operator<<(poVar4,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    Colour::~Colour(&local_31);
    poVar4 = (this->super_StreamingReporterBase).stream;
    local_31.m_moved = false;
    Colour::use(ReconstructedExpression);
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar9);
    std::operator<<(poVar4,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    Colour::~Colour(&local_31);
    poVar4 = (this->super_StreamingReporterBase).stream;
    if ((totals->testCases).failedButOk == 0 && (totals->testCases).failed == 0) {
      local_31.m_moved = false;
      Colour::use(BrightGreen);
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar5);
      std::operator<<(poVar4,(string *)local_58);
    }
    else {
      local_31.m_moved = false;
      Colour::use(Green);
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar5);
      std::operator<<(poVar4,(string *)local_58);
    }
  }
  std::__cxx11::string::~string((string *)local_58);
  Colour::~Colour(&local_31);
  std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  return;
}

Assistant:

void printTotalsDivider(Totals const& totals) {
			if (totals.testCases.total() > 0) {
				std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
				std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
				std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
				while (failedRatio + failedButOkRatio + passedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
					findMax(failedRatio, failedButOkRatio, passedRatio)++;
				while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
					findMax(failedRatio, failedButOkRatio, passedRatio)--;

				stream << Colour(Colour::Error) << std::string(failedRatio, '=');
				stream << Colour(Colour::ResultExpectedFailure) << std::string(failedButOkRatio, '=');
				if (totals.testCases.allPassed())
					stream << Colour(Colour::ResultSuccess) << std::string(passedRatio, '=');
				else
					stream << Colour(Colour::Success) << std::string(passedRatio, '=');
			}
			else {
				stream << Colour(Colour::Warning) << std::string(CATCH_CONFIG_CONSOLE_WIDTH - 1, '=');
			}
			stream << "\n";
		}